

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

fitsfile *
ffhist3(fitsfile *fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
       char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  int iVar1;
  fitsfile *local_120;
  double weight;
  double binsize [4];
  double amax [4];
  double amin [4];
  long haxes [4];
  int local_8c;
  int local_88;
  int wtcolnum;
  int colnum [4];
  fitsfile *pfStack_70;
  int bitpix;
  fitsfile *histptr;
  double weightin_local;
  double *minin_local;
  char (*colname_local) [71];
  int naxis_local;
  int imagetype_local;
  char *outfile_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    histptr = (fitsfile *)weightin;
    weightin_local = (double)minin;
    minin_local = (double *)colname;
    colname_local._0_4_ = naxis;
    colname_local._4_4_ = imagetype;
    _naxis_local = outfile;
    outfile_local = (char *)fptr;
    if (naxis < 5) {
      if (fptr->HDUposition != fptr->Fptr->curhdu) {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      if (colname_local._4_4_ == 0xb) {
        colnum[3] = 8;
      }
      else if (colname_local._4_4_ == 0x15) {
        colnum[3] = 0x10;
      }
      else if (colname_local._4_4_ == 0x1f) {
        colnum[3] = 0x20;
      }
      else if (colname_local._4_4_ == 0x2a) {
        colnum[3] = -0x20;
      }
      else {
        if (colname_local._4_4_ != 0x52) {
          *status = 0x19a;
          return (fitsfile *)0x0;
        }
        colnum[3] = -0x40;
      }
      iVar1 = fits_calc_binningd((fitsfile *)outfile_local,(int)colname_local,
                                 (char (*) [71])minin_local,(double *)weightin_local,maxin,binsizein
                                 ,minname,maxname,binname,&local_88,(long *)(amin + 3),amax + 3,
                                 binsize + 3,&weight,status);
      if (iVar1 < 1) {
        if (*wtcol == '\0') {
          local_120 = histptr;
        }
        else {
          iVar1 = ffgky((fitsfile *)outfile_local,0x52,wtcol,&local_120,(char *)0x0,status);
          if (iVar1 != 0) {
            *status = 0;
            iVar1 = ffgcno((fitsfile *)outfile_local,0,wtcol,&local_8c,status);
            if (0 < iVar1) {
              ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
              ffpmsg(wtcol);
              return (fitsfile *)0x0;
            }
            local_120 = (fitsfile *)0xb8a83e285ebab4b7;
          }
        }
        if ((0.0 < (double)local_120) ||
           (((double)local_120 == -9.1191291391491e-36 && (!NAN((double)local_120))))) {
          if ((recip != 0) &&
             (((double)local_120 != -9.1191291391491e-36 || (NAN((double)local_120))))) {
            local_120 = (fitsfile *)(1.0 / (double)local_120);
          }
          iVar1 = ffinit(&stack0xffffffffffffff90,_naxis_local,status);
          if (iVar1 < 1) {
            iVar1 = ffcrim(pfStack_70,colnum[3],(int)colname_local,(long *)(amin + 3),status);
            if (iVar1 < 1) {
              iVar1 = fits_copy_pixlist2image
                                ((fitsfile *)outfile_local,pfStack_70,9,(int)colname_local,&local_88
                                 ,status);
              if (iVar1 < 1) {
                fits_write_keys_histo
                          ((fitsfile *)outfile_local,pfStack_70,(int)colname_local,&local_88,status)
                ;
                fits_rebin_wcsd(pfStack_70,(int)colname_local,amax + 3,&weight,status);
                iVar1 = fits_make_histd((fitsfile *)outfile_local,pfStack_70,colnum[3],
                                        (int)colname_local,(long *)(amin + 3),&local_88,amax + 3,
                                        binsize + 3,&weight,(double)local_120,local_8c,recip,
                                        selectrow,status);
                if (iVar1 < 1) {
                  fptr_local = pfStack_70;
                }
                else {
                  ffpmsg("failed to calculate new histogram values");
                  fptr_local = (fitsfile *)0x0;
                }
              }
              else {
                ffpmsg("failed to copy pixel list keywords to new histogram header");
                fptr_local = (fitsfile *)0x0;
              }
            }
            else {
              ffpmsg("failed to create output histogram FITS image");
              fptr_local = (fitsfile *)0x0;
            }
          }
          else {
            ffpmsg("failed to create temp output file for histogram");
            fptr_local = (fitsfile *)0x0;
          }
        }
        else {
          ffpmsg("Illegal histogramming weighting factor <= 0.");
          *status = 0x7d;
          fptr_local = (fitsfile *)0x0;
        }
      }
      else {
        ffpmsg("failed to determine binning parameters");
        fptr_local = (fitsfile *)0x0;
      }
    }
    else {
      ffpmsg("histogram has more than 4 dimensions");
      *status = 0x140;
      fptr_local = (fitsfile *)0x0;
    }
  }
  else {
    fptr_local = (fitsfile *)0x0;
  }
  return fptr_local;
}

Assistant:

fitsfile *ffhist3(fitsfile *fptr, /* I - ptr to table with X and Y cols*/
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    fitsfile *histptr;
    int   bitpix, colnum[4], wtcolnum;
    long haxes[4];
    double amin[4], amax[4], binsize[4],  weight;

    if (*status > 0)
        return(NULL);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
	*status = BAD_DIMEN;
        return(NULL);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else{
        *status = BAD_DATATYPE;
        return(NULL);
    }
    
    /*    Calculate the binning parameters:    */
    /*   columm numbers, axes length, min values,  max values, and binsizes.  */

    if (fits_calc_binningd(
      fptr, naxis, colname, minin, maxin, binsizein, minname, maxname, binname,
      colnum, haxes, amin, amax, binsize, status) > 0)
    {
       ffpmsg("failed to determine binning parameters");
        return(NULL);
    }
 
    /* get the histogramming weighting factor, if any */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (fits_read_key(fptr, TDOUBLE, wtcol, &weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(fptr, CASEINSEN, wtcol, &wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(NULL);
            }

            weight = DOUBLENULLVALUE;
        }
    }
    else
        weight = (double) weightin;

    if (weight <= 0. && weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
	*status = URL_PARSE_ERROR;
        return(NULL);
    }

    if (recip && weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       weight = (double) (1.0 / weight);

    /* size of histogram is now known, so create temp output file */
    if (fits_create_file(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(NULL);
    }

    /* create output FITS image HDU */
    if (ffcrim(histptr, bitpix, naxis, haxes, status) > 0)
    {
        ffpmsg("failed to create output histogram FITS image");
        return(NULL);
    }

    /* copy header keywords, converting pixel list WCS keywords to image WCS */
    if (fits_copy_pixlist2image(fptr, histptr, 9, naxis, colnum, status) > 0)
    {
        ffpmsg("failed to copy pixel list keywords to new histogram header");
        return(NULL);
    }

    /* if the table columns have no WCS keywords, then write default keywords */
    fits_write_keys_histo(fptr, histptr, naxis, colnum, status);
    
    /* update the WCS keywords for the ref. pixel location, and pixel size */
    fits_rebin_wcsd(histptr, naxis, amin, binsize,  status);      
    
    /* now compute the output image by binning the column values */
    if (fits_make_histd(fptr, histptr, bitpix, naxis, haxes, colnum, amin, amax,
        binsize, weight, wtcolnum, recip, selectrow, status) > 0)
    {
        ffpmsg("failed to calculate new histogram values");
        return(NULL);
    }
              
    return(histptr);
}